

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

ssize_t __thiscall OPL3::write(OPL3 *this,int __fd,void *__buf,size_t __n)

{
  Operator *this_00;
  Channel *pCVar1;
  int iVar2;
  uint uVar3;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  undefined4 extraout_var;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ssize_t extraout_RAX_06;
  ssize_t extraout_RAX_07;
  uint uVar4;
  
  uVar3 = (uint)__buf;
  uVar4 = __fd << 8 | uVar3;
  if (uVar4 < 0x200) {
    this->registers[uVar4] = (BYTE)__n;
    uVar4 = uVar3 & 0xe0;
    if (uVar4 == 0xc0) {
      if ((int)uVar3 < 0xc9) {
        Channel::update_CHD1_CHC1_CHB1_CHA1_FB3_CNT1(this->channels[__fd][uVar3 & 0xf],this);
        return extraout_RAX_01;
      }
    }
    else if (uVar4 == 0xa0) {
      if (uVar3 == 0xbd) {
        if (__fd == 0) {
          update_DAM1_DVB1_RYT1_BD1_SD1_TOM1_TC1_HH1(this);
          return extraout_RAX_00;
        }
      }
      else {
        if ((int)uVar3 < 0xb9 && (uVar3 & 0xf0) == 0xb0) {
          Channel::update_2_KON1_BLOCK3_FNUMH2(this->channels[__fd][uVar3 & 0xf],this);
          return extraout_RAX_03;
        }
        if ((int)uVar3 < 0xa9 && (uVar3 & 0xf0) == 0xa0) {
          pCVar1 = this->channels[__fd][uVar3 & 0xf];
          pCVar1->fnuml = (uint)this->registers[(long)pCVar1->channelBaseAddress + 0xa0];
          iVar2 = (*pCVar1->_vptr_Channel[5])
                            (pCVar1,this,(ulong)(uVar3 & 0xf),pCVar1->_vptr_Channel[5]);
          return CONCAT44(extraout_var,iVar2);
        }
      }
    }
    else if (((ulong)__buf & 0xe0) == 0) {
      if (__fd == 1) {
        if (uVar3 == 5) {
          update_7_NEW1(this);
          return extraout_RAX_04;
        }
        if (uVar3 == 4) {
          this->connectionsel = this->registers[0x104] & 0x3f;
          set4opConnections(this);
          return extraout_RAX;
        }
      }
      else if (uVar3 == 8) {
        this->nts = *(uint *)(this->registers + 8) >> 6 & 1;
        return (ssize_t)this;
      }
    }
    else {
      this_00 = this->operators[__fd][uVar3 & 0x1f];
      if (this_00 != (Operator *)0x0) {
        switch(uVar4 - 0x20 >> 5) {
        case 0:
          Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(this_00,this);
          return extraout_RAX_02;
        case 1:
          Operator::update_KSL2_TL6(this_00,this);
          return extraout_RAX_06;
        case 2:
          Operator::update_AR4_DR4(this_00,this);
          return extraout_RAX_05;
        case 3:
          Operator::update_SL4_RR4(this_00,this);
          return extraout_RAX_07;
        case 6:
          uVar3 = this->registers[(long)this_00->operatorBaseAddress + 0xe0] & 7;
          this_00->ws = uVar3;
          return (ulong)uVar3;
        }
      }
    }
  }
  return (ssize_t)this;
}

Assistant:

void OPL3::write(int array, int address, int data) {
    // The OPL3 has two registers arrays, each with adresses ranging
    // from 0x00 to 0xF5.
    // This emulator uses one array, with the two original register arrays
    // starting at 0x00 and at 0x100.
    int registerAddress = (array<<8) | address;        
    // If the address is out of the OPL3 memory map, returns.
    if(registerAddress<0 || registerAddress>=0x200) return;

    registers[registerAddress] = data;
    switch(address&0xE0) {
        // The first 3 bits masking gives the type of the register by using its base address:
        // 0x00, 0x20, 0x40, 0x60, 0x80, 0xA0, 0xC0, 0xE0 
        // When it is needed, we further separate the register type inside each base address,
        // which is the case of 0x00 and 0xA0.
        
        // Through out this emulator we will use the same name convention to
        // reference a byte with several bit registers.
        // The name of each bit register will be followed by the number of bits
        // it occupies inside the byte. 
        // Numbers without accompanying names are unused bits.
        case 0x00:
            // Unique registers for the entire OPL3:                
           if(array==1) {
                if(address==0x04) 
                    update_2_CONNECTIONSEL6();
                else if(address==0x05) 
                    update_7_NEW1();
            }
            else if(address==0x08) update_1_NTS1_6();
            break;
            
        case 0xA0:
            // 0xBD is a control register for the entire OPL3:
            if(address==0xBD) {
                if(array==0) 
                    update_DAM1_DVB1_RYT1_BD1_SD1_TOM1_TC1_HH1();
                break;
            }
            // Registers for each channel are in A0-A8, B0-B8, C0-C8, in both register arrays.
            // 0xB0...0xB8 keeps kon,block,fnum(h) for each channel.
            if( (address&0xF0) == 0xB0 && address <= 0xB8) {
                // If the address is in the second register array, adds 9 to the channel number.
                // The channel number is given by the last four bits, like in A0,...,A8.
                channels[array][address&0x0F]->update_2_KON1_BLOCK3_FNUMH2(this);
                break;                    
            }
            // 0xA0...0xA8 keeps fnum(l) for each channel.
            if( (address&0xF0) == 0xA0 && address <= 0xA8)
                channels[array][address&0x0F]->update_FNUML8(this);
            break;                    
        // 0xC0...0xC8 keeps cha,chb,chc,chd,fb,cnt for each channel:
        case 0xC0:
            if(address <= 0xC8)
                channels[array][address&0x0F]->update_CHD1_CHC1_CHB1_CHA1_FB3_CNT1(this);
            break;
            
        // Registers for each of the 36 Operators:
        default:
            int operatorOffset = address&0x1F;
            if(operators[array][operatorOffset] == NULL) break;
            switch(address&0xE0) {
                // 0x20...0x35 keeps am,vib,egt,ksr,mult for each operator:                
                case 0x20:
                    operators[array][operatorOffset]->update_AM1_VIB1_EGT1_KSR1_MULT4(this);
                    break;
                // 0x40...0x55 keeps ksl,tl for each operator: 
                case 0x40:
                    operators[array][operatorOffset]->update_KSL2_TL6(this);
                    break;
                // 0x60...0x75 keeps ar,dr for each operator: 
                case 0x60:
                    operators[array][operatorOffset]->update_AR4_DR4(this);
                    break;
                // 0x80...0x95 keeps sl,rr for each operator:
                case 0x80:
                    operators[array][operatorOffset]->update_SL4_RR4(this);
                    break;
                // 0xE0...0xF5 keeps ws for each operator:
                case 0xE0:     
                    operators[array][operatorOffset]->update_5_WS3(this);
            }
    }
}